

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::MakeUID(uint *seed)

{
  int iVar1;
  uint *in_RDI;
  int32 n;
  int32 nn;
  int i;
  uint64 uid;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0;
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    iVar1 = rand_r(in_RDI);
    local_10 = (long)(int)(iVar1 >> 4 & 0xff) | local_10 << 8;
  }
  return local_10;
}

Assistant:

uint64 MakeUID(unsigned int* seed) {
  uint64 uid = 0;

  for (int i = 0; i < 7; ++i) {  // avoid problems with 8-byte values
    uid <<= 8;

// TODO(fgalligan): Move random number generation to platform specific code.
#ifdef _WIN32
    (void)seed;
    const int32 nn = rand();
#elif defined(__ANDROID__)
    (void)seed;
    int32 temp_num = 1;
    int fd = open("/dev/urandom", O_RDONLY);
    if (fd != -1) {
      read(fd, &temp_num, sizeof(temp_num));
      close(fd);
    }
    const int32 nn = temp_num;
#else
    const int32 nn = rand_r(seed);
#endif
    const int32 n = 0xFF & (nn >> 4);  // throw away low-order bits

    uid |= n;
  }

  return uid;
}